

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

bool __thiscall Socket::makeKeepAlive(Socket *this,int idle,int intv,int cnt)

{
  int iVar1;
  undefined4 local_2c;
  undefined4 local_28;
  int keepAlive_1;
  int keepAlive;
  int cnt_local;
  int intv_local;
  int idle_local;
  Socket *this_local;
  
  keepAlive_1 = cnt;
  keepAlive = intv;
  cnt_local = idle;
  _intv_local = this;
  if (idle < 0) {
    local_28 = 0;
    iVar1 = setsockopt(this->_fd,1,9,&local_28,4);
    if (iVar1 == -1) {
      return false;
    }
  }
  else {
    local_2c = 1;
    iVar1 = setsockopt(this->_fd,1,9,&local_2c,4);
    if (iVar1 == -1) {
      return false;
    }
    iVar1 = setsockopt(this->_fd,6,4,&cnt_local,4);
    if (iVar1 == -1) {
      return false;
    }
    iVar1 = setsockopt(this->_fd,6,5,&keepAlive,4);
    if (iVar1 == -1) {
      return false;
    }
    iVar1 = setsockopt(this->_fd,6,6,&keepAlive_1,4);
    if (iVar1 == -1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Socket::makeKeepAlive( int idle, int intv, int cnt )
{
    if(idle < 0)
    {
        int keepAlive = 0;
        if(setsockopt(_fd, SOL_SOCKET, SO_KEEPALIVE, (const char *)&keepAlive, sizeof(keepAlive)) == SOCKET_ERROR)
            return false;
    }
    else
    {
        int keepAlive = 1;
        if(setsockopt(_fd, SOL_SOCKET, SO_KEEPALIVE, (const char *)&keepAlive, sizeof(keepAlive)) == SOCKET_ERROR)
            return false;
#ifndef _WIN32
#ifdef SYSTEM_MACOS
        if(setsockopt(_fd, IPPROTO_TCP, TCP_KEEPALIVE, (const char *)&idle, sizeof(idle)) == SOCKET_ERROR)
            return false;
#else
        if(setsockopt(_fd, IPPROTO_TCP, TCP_KEEPIDLE, (const char *)&idle, sizeof(idle)) == SOCKET_ERROR)
            return false;
        if(setsockopt(_fd, IPPROTO_TCP, TCP_KEEPINTVL, (const char *)&intv, sizeof(intv)) == SOCKET_ERROR)
            return false;
        if(setsockopt(_fd, IPPROTO_TCP, TCP_KEEPCNT, (const char *)&cnt, sizeof(cnt)) == SOCKET_ERROR)
            return false;
#endif
#endif
    }
    return true;
}